

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_arithm<int>(uint length,int value1,int value2,bool allowTrash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  int *piVar19;
  undefined1 (*pSrc1) [16];
  undefined1 (*pSrc2) [16];
  element_type *pDst;
  undefined8 *puVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint local_2228;
  uint local_2224;
  uint i_19;
  uint i_18;
  uint i_17;
  uint i_15;
  uint i_13;
  uint i_11;
  uint i_9;
  uint i_8;
  uint i_6;
  uint i_4;
  int r;
  uint i_2;
  int *result;
  int *v2;
  int *v1;
  shared_ptr<int> presult;
  undefined1 local_21c0 [8];
  shared_ptr<int> pv2;
  shared_ptr<int> pv1;
  bool allowTrash_local;
  int value2_local;
  int value1_local;
  uint length_local;
  int i_1;
  undefined8 uStack_2180;
  uint local_216c;
  undefined1 (*local_2168) [16];
  int local_2160;
  int local_215c;
  undefined8 uStack_2158;
  int i;
  undefined8 uStack_2150;
  uint local_2144;
  undefined1 (*local_2140) [16];
  int local_2134;
  int local_2130;
  uint local_212c;
  int i_3;
  undefined1 (*local_2120) [16];
  undefined1 (*local_2118) [16];
  int local_2110;
  uint local_210c;
  int i_5;
  undefined1 (*local_2100) [16];
  undefined1 (*local_20f8) [16];
  int local_20f0;
  uint local_20ec;
  int i_7;
  undefined1 (*local_20e0) [16];
  undefined1 (*local_20d8) [16];
  uint local_20cc;
  element_type *local_20c8;
  undefined1 (*local_20c0) [16];
  undefined1 (*local_20b8) [16];
  int local_20ac;
  undefined8 uStack_20a8;
  int i_10;
  undefined8 uStack_20a0;
  uint local_208c;
  element_type *local_2088;
  int local_207c;
  undefined1 (*local_2078) [16];
  int local_206c;
  undefined8 uStack_2068;
  int i_12;
  undefined8 uStack_2060;
  uint local_204c;
  element_type *local_2048;
  int local_203c;
  undefined1 (*local_2038) [16];
  int local_202c;
  undefined8 uStack_2028;
  int i_14;
  undefined8 uStack_2020;
  uint local_200c;
  element_type *local_2008;
  int local_1ffc;
  undefined1 (*local_1ff8) [16];
  int local_1fec;
  undefined8 uStack_1fe8;
  int i_16;
  undefined8 uStack_1fe0;
  uint local_1fcc;
  element_type *local_1fc8;
  int local_1fbc;
  undefined1 (*local_1fb8) [16];
  uint local_1fac;
  element_type *local_1fa8;
  int local_1f9c;
  undefined1 (*local_1f98) [16];
  uint local_1f8c;
  element_type *local_1f88;
  int local_1f7c;
  undefined1 (*local_1f78) [16];
  int local_1f6c;
  undefined1 (*local_1f68) [16];
  undefined1 *local_1f60;
  int local_1f54;
  undefined1 (*local_1f50) [16];
  uint *local_1f48;
  int local_1f40;
  int local_1f3c;
  int local_1f38;
  int local_1f34;
  int local_1f30;
  int local_1f2c;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined1 (*local_1e30) [16];
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined1 (*local_1e10) [16];
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined1 (*local_1df0) [16];
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined1 (*local_1dd0) [16];
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined1 (*local_1db0) [16];
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined1 (*local_1d90) [16];
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined1 (*local_1d70) [16];
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined1 (*local_1d50) [16];
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined1 (*local_1d30) [16];
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined1 (*local_1d10) [16];
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined1 (*local_1cf0) [16];
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined1 (*local_1cd0) [16];
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined1 (*local_1cb0) [16];
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined1 (*local_1c90) [16];
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined1 (*local_1c70) [16];
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined1 (*local_1c50) [16];
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined1 (*local_1c30) [16];
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined1 (*local_1c10) [16];
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined1 (*local_1bf0) [16];
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined1 (*local_1bd0) [16];
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined1 (*local_1bb0) [16];
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined1 (*local_1b90) [16];
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined1 (*local_1b70) [16];
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined1 (*local_1b50) [16];
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined1 (*local_1b30) [16];
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined1 (*local_1b10) [16];
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined1 (*local_1af0) [16];
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined1 (*local_1ad0) [16];
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  int local_1ab8;
  int local_1ab4;
  int local_1ab0;
  int local_1aac;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  int local_1a98;
  int local_1a94;
  int local_1a90;
  int local_1a8c;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  int local_1a78;
  int local_1a74;
  int local_1a70;
  int local_1a6c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  int local_1a58;
  int local_1a54;
  int local_1a50;
  int local_1a4c;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  int local_1a38;
  int local_1a34;
  int local_1a30;
  int local_1a2c;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  int local_1a18;
  int local_1a14;
  int local_1a10;
  int local_1a0c;
  undefined8 uStack_1a08;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  element_type *local_1980;
  undefined1 (*local_1978) [16];
  undefined1 (*local_1970) [16];
  int local_17a8;
  int iStack_17a4;
  int iStack_17a0;
  int iStack_179c;
  int local_1798;
  int iStack_1794;
  int iStack_1790;
  int iStack_178c;
  int local_1788;
  int iStack_1784;
  int iStack_1780;
  int iStack_177c;
  int local_1778;
  int iStack_1774;
  int iStack_1770;
  int iStack_176c;
  int local_1768;
  int iStack_1764;
  int iStack_1760;
  int iStack_175c;
  int local_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int local_1748;
  int iStack_1744;
  int iStack_1740;
  int iStack_173c;
  int local_1738;
  int iStack_1734;
  int iStack_1730;
  int iStack_172c;
  int local_1728;
  int iStack_1724;
  int iStack_1720;
  int iStack_171c;
  int local_1718;
  int iStack_1714;
  int iStack_1710;
  int iStack_170c;
  int local_1708;
  int iStack_1704;
  int iStack_1700;
  int iStack_16fc;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  int local_16e8;
  int iStack_16e4;
  int iStack_16e0;
  int iStack_16dc;
  int local_16d8;
  int iStack_16d4;
  int iStack_16d0;
  int iStack_16cc;
  __m128i b3_1;
  __m128i b2_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a3_1;
  __m128i a2_1;
  __m128i a1_1;
  __m128i a0_1;
  element_type *local_1560;
  undefined1 (*local_1558) [16];
  undefined1 (*local_1550) [16];
  int local_12a8;
  int iStack_12a4;
  int iStack_12a0;
  int iStack_129c;
  int local_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  int local_1288;
  int iStack_1284;
  int iStack_1280;
  int iStack_127c;
  int local_1278;
  int iStack_1274;
  int iStack_1270;
  int iStack_126c;
  int local_1268;
  int iStack_1264;
  int iStack_1260;
  int iStack_125c;
  int local_1258;
  int iStack_1254;
  int iStack_1250;
  int iStack_124c;
  int local_1248;
  int iStack_1244;
  int iStack_1240;
  int iStack_123c;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  int local_1228;
  int iStack_1224;
  int iStack_1220;
  int iStack_121c;
  int local_1218;
  int iStack_1214;
  int iStack_1210;
  int iStack_120c;
  int local_1208;
  int iStack_1204;
  int iStack_1200;
  int iStack_11fc;
  int local_11f8;
  int iStack_11f4;
  int iStack_11f0;
  int iStack_11ec;
  int local_11e8;
  int iStack_11e4;
  int iStack_11e0;
  int iStack_11dc;
  int local_11d8;
  int iStack_11d4;
  int iStack_11d0;
  int iStack_11cc;
  __m128i b3_2;
  __m128i b2_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a3_2;
  __m128i a2_2;
  __m128i a1_2;
  __m128i a0_2;
  element_type *local_1140;
  undefined1 (*local_1138) [16];
  undefined1 (*local_1130) [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1068;
  undefined8 uStack_1060;
  int local_da4;
  element_type *local_da0;
  undefined1 (*local_d90) [16];
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int local_a74;
  element_type *local_a70;
  undefined1 (*local_a60) [16];
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  int local_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_744;
  element_type *local_740;
  undefined1 (*local_730) [16];
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_334;
  element_type *local_330;
  undefined1 (*local_320) [16];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_258;
  undefined8 uStack_250;
  
  piVar19 = sse::common::malloc<int>(length);
  std::shared_ptr<int>::shared_ptr<int,void(*)(int*),void>
            ((shared_ptr<int> *)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,piVar19,sse::common::free<int>);
  piVar19 = sse::common::malloc<int>(length);
  std::shared_ptr<int>::shared_ptr<int,void(*)(int*),void>
            ((shared_ptr<int> *)local_21c0,piVar19,sse::common::free<int>);
  piVar19 = sse::common::malloc<int>(length + 1);
  std::shared_ptr<int>::shared_ptr<int,void(*)(int*),void>
            ((shared_ptr<int> *)&v1,piVar19,sse::common::free<int>);
  pSrc1 = (undefined1 (*) [16])
          std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)
                     &pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pSrc2 = (undefined1 (*) [16])
          std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)local_21c0);
  pDst = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&v1);
  pDst[length] = 0x7f;
  uStack_2158 = CONCAT44(value1,value1);
  uStack_2150 = CONCAT44(value1,value1);
  local_1f60 = (undefined1 *)&stack0xffffffffffffdea8;
  local_334 = (int)length >> 2;
  local_1f68 = pSrc1;
  for (local_1f6c = local_334; 3 < local_1f6c; local_1f6c = local_1f6c + -4) {
    local_1c90 = local_1f68;
    local_1c70 = local_1f68;
    *(undefined8 *)*local_1f68 = uStack_2158;
    *(undefined8 *)(*local_1f68 + 8) = uStack_2150;
    local_1cb0 = local_1f68 + 1;
    *(undefined8 *)*local_1cb0 = uStack_2158;
    *(undefined8 *)(local_1f68[1] + 8) = uStack_2150;
    local_1cd0 = local_1f68 + 2;
    *(undefined8 *)*local_1cd0 = uStack_2158;
    *(undefined8 *)(local_1f68[2] + 8) = uStack_2150;
    local_1cf0 = local_1f68 + 3;
    *(undefined8 *)*local_1cf0 = uStack_2158;
    *(undefined8 *)(local_1f68[3] + 8) = uStack_2150;
    local_1f68 = local_1f68 + 4;
    local_1eb8 = uStack_2158;
    uStack_1eb0 = uStack_2150;
    local_1ea8 = uStack_2158;
    uStack_1ea0 = uStack_2150;
    local_1e98 = uStack_2158;
    uStack_1e90 = uStack_2150;
    local_1e88 = uStack_2158;
    uStack_1e80 = uStack_2150;
    local_1d08 = uStack_2158;
    uStack_1d00 = uStack_2150;
    local_1ce8 = uStack_2158;
    uStack_1ce0 = uStack_2150;
    local_1cc8 = uStack_2158;
    uStack_1cc0 = uStack_2150;
    local_1ca8 = uStack_2158;
    uStack_1ca0 = uStack_2150;
    local_1c88 = uStack_2158;
    uStack_1c80 = uStack_2150;
    local_1c68 = uStack_2158;
    uStack_1c60 = uStack_2150;
    local_1c50 = local_1cb0;
    local_1c48 = uStack_2158;
    uStack_1c40 = uStack_2150;
    local_1c30 = local_1cd0;
    local_1c28 = uStack_2158;
    uStack_1c20 = uStack_2150;
    local_1c10 = local_1cf0;
  }
  if (1 < local_1f6c) {
    local_1d10 = local_1f68;
    local_1bf0 = local_1f68;
    *(undefined8 *)*local_1f68 = uStack_2158;
    *(undefined8 *)(*local_1f68 + 8) = uStack_2150;
    local_1d30 = local_1f68 + 1;
    *(undefined8 *)*local_1d30 = uStack_2158;
    *(undefined8 *)(local_1f68[1] + 8) = uStack_2150;
    local_1f6c = local_1f6c + -2;
    local_1f68 = local_1f68 + 2;
    local_1e78 = uStack_2158;
    uStack_1e70 = uStack_2150;
    local_1e68 = uStack_2158;
    uStack_1e60 = uStack_2150;
    local_1d48 = uStack_2158;
    uStack_1d40 = uStack_2150;
    local_1d28 = uStack_2158;
    uStack_1d20 = uStack_2150;
    local_1c08 = uStack_2158;
    uStack_1c00 = uStack_2150;
    local_1be8 = uStack_2158;
    uStack_1be0 = uStack_2150;
    local_1bd0 = local_1d30;
  }
  if (local_1f6c != 0) {
    local_1d50 = local_1f68;
    local_1bb0 = local_1f68;
    *(undefined8 *)*local_1f68 = uStack_2158;
    *(undefined8 *)(*local_1f68 + 8) = uStack_2150;
    local_1e58 = uStack_2158;
    uStack_1e50 = uStack_2150;
    local_1d68 = uStack_2158;
    uStack_1d60 = uStack_2150;
    local_1bc8 = uStack_2158;
    uStack_1bc0 = uStack_2150;
  }
  for (local_215c = length - (length & 3); local_215c < (int)length; local_215c = local_215c + 1) {
    *(int *)(*pSrc1 + (long)local_215c * 4) = value1;
  }
  _length_local = CONCAT44(value2,value2);
  uStack_2180 = CONCAT44(value2,value2);
  local_1f48 = &length_local;
  local_1f50 = pSrc2;
  for (local_1f54 = local_334; 3 < local_1f54; local_1f54 = local_1f54 + -4) {
    local_1d70 = local_1f50;
    local_1b90 = local_1f50;
    *(undefined8 *)*local_1f50 = _length_local;
    *(undefined8 *)(*local_1f50 + 8) = uStack_2180;
    local_1d90 = local_1f50 + 1;
    *(undefined8 *)*local_1d90 = _length_local;
    *(undefined8 *)(local_1f50[1] + 8) = uStack_2180;
    local_1db0 = local_1f50 + 2;
    *(undefined8 *)*local_1db0 = _length_local;
    *(undefined8 *)(local_1f50[2] + 8) = uStack_2180;
    local_1dd0 = local_1f50 + 3;
    *(undefined8 *)*local_1dd0 = _length_local;
    *(undefined8 *)(local_1f50[3] + 8) = uStack_2180;
    local_1f50 = local_1f50 + 4;
    local_1f28 = _length_local;
    uStack_1f20 = uStack_2180;
    local_1f18 = _length_local;
    uStack_1f10 = uStack_2180;
    local_1f08 = _length_local;
    uStack_1f00 = uStack_2180;
    local_1ef8 = _length_local;
    uStack_1ef0 = uStack_2180;
    local_1de8 = _length_local;
    uStack_1de0 = uStack_2180;
    local_1dc8 = _length_local;
    uStack_1dc0 = uStack_2180;
    local_1da8 = _length_local;
    uStack_1da0 = uStack_2180;
    local_1d88 = _length_local;
    uStack_1d80 = uStack_2180;
    local_1ba8 = _length_local;
    uStack_1ba0 = uStack_2180;
    local_1b88 = _length_local;
    uStack_1b80 = uStack_2180;
    local_1b70 = local_1d90;
    local_1b68 = _length_local;
    uStack_1b60 = uStack_2180;
    local_1b50 = local_1db0;
    local_1b48 = _length_local;
    uStack_1b40 = uStack_2180;
    local_1b30 = local_1dd0;
  }
  if (1 < local_1f54) {
    local_1df0 = local_1f50;
    local_1b10 = local_1f50;
    *(undefined8 *)*local_1f50 = _length_local;
    *(undefined8 *)(*local_1f50 + 8) = uStack_2180;
    local_1e10 = local_1f50 + 1;
    *(undefined8 *)*local_1e10 = _length_local;
    *(undefined8 *)(local_1f50[1] + 8) = uStack_2180;
    local_1f54 = local_1f54 + -2;
    local_1f50 = local_1f50 + 2;
    local_1ee8 = _length_local;
    uStack_1ee0 = uStack_2180;
    local_1ed8 = _length_local;
    uStack_1ed0 = uStack_2180;
    local_1e28 = _length_local;
    uStack_1e20 = uStack_2180;
    local_1e08 = _length_local;
    uStack_1e00 = uStack_2180;
    local_1b28 = _length_local;
    uStack_1b20 = uStack_2180;
    local_1b08 = _length_local;
    uStack_1b00 = uStack_2180;
    local_1af0 = local_1e10;
  }
  if (local_1f54 != 0) {
    local_1e30 = local_1f50;
    local_1ad0 = local_1f50;
    *(undefined8 *)*local_1f50 = _length_local;
    *(undefined8 *)(*local_1f50 + 8) = uStack_2180;
    local_1ec8 = _length_local;
    uStack_1ec0 = uStack_2180;
    local_1e48 = _length_local;
    uStack_1e40 = uStack_2180;
    local_1ae8 = _length_local;
    uStack_1ae0 = uStack_2180;
  }
  for (value1_local = length - (length & 3); value1_local < (int)length;
      value1_local = value1_local + 1) {
    *(int *)(*pSrc2 + (long)value1_local * 4) = value2;
  }
  local_216c = length;
  local_2168 = pSrc2;
  local_2160 = value2;
  local_2144 = length;
  local_2140 = pSrc1;
  local_2134 = value1;
  local_1f30 = value1;
  local_1f2c = value2;
  local_1ac8 = _length_local;
  uStack_1ac0 = uStack_2180;
  local_1ab8 = value2;
  local_1ab4 = value2;
  local_1ab0 = value2;
  local_1aac = value2;
  local_1aa8 = uStack_2158;
  uStack_1aa0 = uStack_2150;
  local_1a98 = value1;
  local_1a94 = value1;
  local_1a90 = value1;
  local_1a8c = value1;
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(*(int *)(*pSrc1 + (ulong)i_4 * 4),value1);
    if ((!bVar18) ||
       (bVar18 = anon_unknown.dwarf_157a4::equal<int>(*(int *)(*pSrc2 + (ulong)i_4 * 4),value2),
       !bVar18)) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x1a;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  local_1980 = pDst;
  local_1978 = pSrc2;
  local_1970 = pSrc1;
  for (a0[1]._4_4_ = local_334; 3 < a0[1]._4_4_; a0[1]._4_4_ = a0[1]._4_4_ + -4) {
    uVar1 = *(undefined8 *)local_1970[1];
    uVar2 = *(undefined8 *)(local_1970[1] + 8);
    uVar3 = *(undefined8 *)local_1970[2];
    uVar4 = *(undefined8 *)(local_1970[2] + 8);
    uVar5 = *(undefined8 *)local_1970[3];
    uVar6 = *(undefined8 *)(local_1970[3] + 8);
    uVar7 = *(undefined8 *)local_1978[1];
    uVar8 = *(undefined8 *)(local_1978[1] + 8);
    b3[1] = *(longlong *)local_1978[2];
    uVar9 = *(undefined8 *)(local_1978[2] + 8);
    uStack_1a08 = *(undefined8 *)local_1978[3];
    b3[0] = *(longlong *)(local_1978[3] + 8);
    local_1738 = (int)*(undefined8 *)*local_1970;
    iStack_1734 = (int)((ulong)*(undefined8 *)*local_1970 >> 0x20);
    iStack_1730 = (int)*(undefined8 *)(*local_1970 + 8);
    iStack_172c = (int)((ulong)*(undefined8 *)(*local_1970 + 8) >> 0x20);
    local_1748 = (int)*(undefined8 *)*local_1978;
    iStack_1744 = (int)((ulong)*(undefined8 *)*local_1978 >> 0x20);
    iStack_1740 = (int)*(undefined8 *)(*local_1978 + 8);
    iStack_173c = (int)((ulong)*(undefined8 *)(*local_1978 + 8) >> 0x20);
    *(ulong *)local_1980 = CONCAT44(iStack_1734 + iStack_1744,local_1738 + local_1748);
    *(ulong *)(local_1980 + 2) = CONCAT44(iStack_172c + iStack_173c,iStack_1730 + iStack_1740);
    local_1758 = (int)uVar1;
    iStack_1754 = (int)((ulong)uVar1 >> 0x20);
    iStack_1750 = (int)uVar2;
    iStack_174c = (int)((ulong)uVar2 >> 0x20);
    local_1768 = (int)uVar7;
    iStack_1764 = (int)((ulong)uVar7 >> 0x20);
    iStack_1760 = (int)uVar8;
    iStack_175c = (int)((ulong)uVar8 >> 0x20);
    *(ulong *)(local_1980 + 4) = CONCAT44(iStack_1754 + iStack_1764,local_1758 + local_1768);
    *(ulong *)(local_1980 + 6) = CONCAT44(iStack_174c + iStack_175c,iStack_1750 + iStack_1760);
    local_1778 = (int)uVar3;
    iStack_1774 = (int)((ulong)uVar3 >> 0x20);
    iStack_1770 = (int)uVar4;
    iStack_176c = (int)((ulong)uVar4 >> 0x20);
    local_1788 = (int)b3[1];
    iStack_1784 = (int)((ulong)b3[1] >> 0x20);
    iStack_1780 = (int)uVar9;
    iStack_177c = (int)((ulong)uVar9 >> 0x20);
    *(ulong *)(local_1980 + 8) = CONCAT44(iStack_1774 + iStack_1784,local_1778 + local_1788);
    *(ulong *)(local_1980 + 10) = CONCAT44(iStack_176c + iStack_177c,iStack_1770 + iStack_1780);
    local_1798 = (int)uVar5;
    iStack_1794 = (int)((ulong)uVar5 >> 0x20);
    iStack_1790 = (int)uVar6;
    iStack_178c = (int)((ulong)uVar6 >> 0x20);
    local_17a8 = (int)uStack_1a08;
    iStack_17a4 = (int)((ulong)uStack_1a08 >> 0x20);
    iStack_17a0 = (int)b3[0];
    iStack_179c = (int)((ulong)b3[0] >> 0x20);
    *(ulong *)(local_1980 + 0xc) = CONCAT44(iStack_1794 + iStack_17a4,local_1798 + local_17a8);
    *(ulong *)(local_1980 + 0xe) = CONCAT44(iStack_178c + iStack_179c,iStack_1790 + iStack_17a0);
    local_1970 = local_1970 + 4;
    local_1978 = local_1978 + 4;
    local_1980 = local_1980 + 0x10;
  }
  if (1 < a0[1]._4_4_) {
    local_16f8 = (int)*(undefined8 *)*local_1970;
    iStack_16f4 = (int)((ulong)*(undefined8 *)*local_1970 >> 0x20);
    iStack_16f0 = (int)*(undefined8 *)(*local_1970 + 8);
    iStack_16ec = (int)((ulong)*(undefined8 *)(*local_1970 + 8) >> 0x20);
    local_1708 = (int)*(undefined8 *)*local_1978;
    iStack_1704 = (int)((ulong)*(undefined8 *)*local_1978 >> 0x20);
    iStack_1700 = (int)*(undefined8 *)(*local_1978 + 8);
    iStack_16fc = (int)((ulong)*(undefined8 *)(*local_1978 + 8) >> 0x20);
    *(ulong *)local_1980 = CONCAT44(iStack_16f4 + iStack_1704,local_16f8 + local_1708);
    *(ulong *)(local_1980 + 2) = CONCAT44(iStack_16ec + iStack_16fc,iStack_16f0 + iStack_1700);
    local_1718 = (int)*(undefined8 *)local_1970[1];
    iStack_1714 = (int)((ulong)*(undefined8 *)local_1970[1] >> 0x20);
    iStack_1710 = (int)*(undefined8 *)(local_1970[1] + 8);
    iStack_170c = (int)((ulong)*(undefined8 *)(local_1970[1] + 8) >> 0x20);
    local_1728 = (int)*(undefined8 *)local_1978[1];
    iStack_1724 = (int)((ulong)*(undefined8 *)local_1978[1] >> 0x20);
    iStack_1720 = (int)*(undefined8 *)(local_1978[1] + 8);
    iStack_171c = (int)((ulong)*(undefined8 *)(local_1978[1] + 8) >> 0x20);
    *(ulong *)(local_1980 + 4) = CONCAT44(iStack_1714 + iStack_1724,local_1718 + local_1728);
    *(ulong *)(local_1980 + 6) = CONCAT44(iStack_170c + iStack_171c,iStack_1710 + iStack_1720);
    a0[1]._4_4_ = a0[1]._4_4_ + -2;
    local_1970 = local_1970 + 2;
    local_1978 = local_1978 + 2;
    local_1980 = local_1980 + 8;
  }
  if (a0[1]._4_4_ != 0) {
    local_16d8 = (int)*(undefined8 *)*local_1970;
    iStack_16d4 = (int)((ulong)*(undefined8 *)*local_1970 >> 0x20);
    iStack_16d0 = (int)*(undefined8 *)(*local_1970 + 8);
    iStack_16cc = (int)((ulong)*(undefined8 *)(*local_1970 + 8) >> 0x20);
    local_16e8 = (int)*(undefined8 *)*local_1978;
    iStack_16e4 = (int)((ulong)*(undefined8 *)*local_1978 >> 0x20);
    iStack_16e0 = (int)*(undefined8 *)(*local_1978 + 8);
    iStack_16dc = (int)((ulong)*(undefined8 *)(*local_1978 + 8) >> 0x20);
    *(ulong *)local_1980 = CONCAT44(iStack_16d4 + iStack_16e4,local_16d8 + local_16e8);
    *(ulong *)(local_1980 + 2) = CONCAT44(iStack_16cc + iStack_16dc,iStack_16d0 + iStack_16e0);
  }
  for (local_2130 = length - (length & 3); local_2130 < (int)length; local_2130 = local_2130 + 1) {
    pDst[local_2130] =
         *(int *)(*pSrc1 + (long)local_2130 * 4) + *(int *)(*pSrc2 + (long)local_2130 * 4);
  }
  local_212c = length;
  _i_3 = pDst;
  local_2120 = pSrc2;
  local_2118 = pSrc1;
  for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[i_8],value1 + value2);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x22;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  local_1560 = pDst;
  local_1558 = pSrc2;
  local_1550 = pSrc1;
  for (a0_1[1]._4_4_ = local_334; 3 < a0_1[1]._4_4_; a0_1[1]._4_4_ = a0_1[1]._4_4_ + -4) {
    uVar1 = *(undefined8 *)local_1550[1];
    uVar2 = *(undefined8 *)(local_1550[1] + 8);
    uVar3 = *(undefined8 *)local_1550[2];
    uVar4 = *(undefined8 *)(local_1550[2] + 8);
    uVar5 = *(undefined8 *)local_1550[3];
    uVar6 = *(undefined8 *)(local_1550[3] + 8);
    uVar7 = *(undefined8 *)local_1558[1];
    uVar8 = *(undefined8 *)(local_1558[1] + 8);
    uVar9 = *(undefined8 *)local_1558[2];
    uVar10 = *(undefined8 *)(local_1558[2] + 8);
    uVar11 = *(undefined8 *)local_1558[3];
    uVar12 = *(undefined8 *)(local_1558[3] + 8);
    local_1238 = (int)*(undefined8 *)*local_1550;
    iStack_1234 = (int)((ulong)*(undefined8 *)*local_1550 >> 0x20);
    iStack_1230 = (int)*(undefined8 *)(*local_1550 + 8);
    iStack_122c = (int)((ulong)*(undefined8 *)(*local_1550 + 8) >> 0x20);
    local_1248 = (int)*(undefined8 *)*local_1558;
    iStack_1244 = (int)((ulong)*(undefined8 *)*local_1558 >> 0x20);
    iStack_1240 = (int)*(undefined8 *)(*local_1558 + 8);
    iStack_123c = (int)((ulong)*(undefined8 *)(*local_1558 + 8) >> 0x20);
    *(ulong *)local_1560 = CONCAT44(iStack_1234 - iStack_1244,local_1238 - local_1248);
    *(ulong *)(local_1560 + 2) = CONCAT44(iStack_122c - iStack_123c,iStack_1230 - iStack_1240);
    local_1258 = (int)uVar1;
    iStack_1254 = (int)((ulong)uVar1 >> 0x20);
    iStack_1250 = (int)uVar2;
    iStack_124c = (int)((ulong)uVar2 >> 0x20);
    local_1268 = (int)uVar7;
    iStack_1264 = (int)((ulong)uVar7 >> 0x20);
    iStack_1260 = (int)uVar8;
    iStack_125c = (int)((ulong)uVar8 >> 0x20);
    *(ulong *)(local_1560 + 4) = CONCAT44(iStack_1254 - iStack_1264,local_1258 - local_1268);
    *(ulong *)(local_1560 + 6) = CONCAT44(iStack_124c - iStack_125c,iStack_1250 - iStack_1260);
    local_1278 = (int)uVar3;
    iStack_1274 = (int)((ulong)uVar3 >> 0x20);
    iStack_1270 = (int)uVar4;
    iStack_126c = (int)((ulong)uVar4 >> 0x20);
    local_1288 = (int)uVar9;
    iStack_1284 = (int)((ulong)uVar9 >> 0x20);
    iStack_1280 = (int)uVar10;
    iStack_127c = (int)((ulong)uVar10 >> 0x20);
    *(ulong *)(local_1560 + 8) = CONCAT44(iStack_1274 - iStack_1284,local_1278 - local_1288);
    *(ulong *)(local_1560 + 10) = CONCAT44(iStack_126c - iStack_127c,iStack_1270 - iStack_1280);
    local_1298 = (int)uVar5;
    iStack_1294 = (int)((ulong)uVar5 >> 0x20);
    iStack_1290 = (int)uVar6;
    iStack_128c = (int)((ulong)uVar6 >> 0x20);
    local_12a8 = (int)uVar11;
    iStack_12a4 = (int)((ulong)uVar11 >> 0x20);
    iStack_12a0 = (int)uVar12;
    iStack_129c = (int)((ulong)uVar12 >> 0x20);
    *(ulong *)(local_1560 + 0xc) = CONCAT44(iStack_1294 - iStack_12a4,local_1298 - local_12a8);
    *(ulong *)(local_1560 + 0xe) = CONCAT44(iStack_128c - iStack_129c,iStack_1290 - iStack_12a0);
    local_1550 = local_1550 + 4;
    local_1558 = local_1558 + 4;
    local_1560 = local_1560 + 0x10;
  }
  if (1 < a0_1[1]._4_4_) {
    local_11f8 = (int)*(undefined8 *)*local_1550;
    iStack_11f4 = (int)((ulong)*(undefined8 *)*local_1550 >> 0x20);
    iStack_11f0 = (int)*(undefined8 *)(*local_1550 + 8);
    iStack_11ec = (int)((ulong)*(undefined8 *)(*local_1550 + 8) >> 0x20);
    local_1208 = (int)*(undefined8 *)*local_1558;
    iStack_1204 = (int)((ulong)*(undefined8 *)*local_1558 >> 0x20);
    iStack_1200 = (int)*(undefined8 *)(*local_1558 + 8);
    iStack_11fc = (int)((ulong)*(undefined8 *)(*local_1558 + 8) >> 0x20);
    *(ulong *)local_1560 = CONCAT44(iStack_11f4 - iStack_1204,local_11f8 - local_1208);
    *(ulong *)(local_1560 + 2) = CONCAT44(iStack_11ec - iStack_11fc,iStack_11f0 - iStack_1200);
    local_1218 = (int)*(undefined8 *)local_1550[1];
    iStack_1214 = (int)((ulong)*(undefined8 *)local_1550[1] >> 0x20);
    iStack_1210 = (int)*(undefined8 *)(local_1550[1] + 8);
    iStack_120c = (int)((ulong)*(undefined8 *)(local_1550[1] + 8) >> 0x20);
    local_1228 = (int)*(undefined8 *)local_1558[1];
    iStack_1224 = (int)((ulong)*(undefined8 *)local_1558[1] >> 0x20);
    iStack_1220 = (int)*(undefined8 *)(local_1558[1] + 8);
    iStack_121c = (int)((ulong)*(undefined8 *)(local_1558[1] + 8) >> 0x20);
    *(ulong *)(local_1560 + 4) = CONCAT44(iStack_1214 - iStack_1224,local_1218 - local_1228);
    *(ulong *)(local_1560 + 6) = CONCAT44(iStack_120c - iStack_121c,iStack_1210 - iStack_1220);
    a0_1[1]._4_4_ = a0_1[1]._4_4_ + -2;
    local_1550 = local_1550 + 2;
    local_1558 = local_1558 + 2;
    local_1560 = local_1560 + 8;
  }
  if (a0_1[1]._4_4_ != 0) {
    local_11d8 = (int)*(undefined8 *)*local_1550;
    iStack_11d4 = (int)((ulong)*(undefined8 *)*local_1550 >> 0x20);
    iStack_11d0 = (int)*(undefined8 *)(*local_1550 + 8);
    iStack_11cc = (int)((ulong)*(undefined8 *)(*local_1550 + 8) >> 0x20);
    local_11e8 = (int)*(undefined8 *)*local_1558;
    iStack_11e4 = (int)((ulong)*(undefined8 *)*local_1558 >> 0x20);
    iStack_11e0 = (int)*(undefined8 *)(*local_1558 + 8);
    iStack_11dc = (int)((ulong)*(undefined8 *)(*local_1558 + 8) >> 0x20);
    *(ulong *)local_1560 = CONCAT44(iStack_11d4 - iStack_11e4,local_11d8 - local_11e8);
    *(ulong *)(local_1560 + 2) = CONCAT44(iStack_11cc - iStack_11dc,iStack_11d0 - iStack_11e0);
  }
  for (local_2110 = length - (length & 3); local_2110 < (int)length; local_2110 = local_2110 + 1) {
    pDst[local_2110] =
         *(int *)(*pSrc1 + (long)local_2110 * 4) - *(int *)(*pSrc2 + (long)local_2110 * 4);
  }
  local_210c = length;
  _i_5 = pDst;
  local_2100 = pSrc2;
  local_20f8 = pSrc1;
  for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[i_9],value1 - value2);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x2a;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  local_1140 = pDst;
  local_1138 = pSrc2;
  local_1130 = pSrc1;
  for (a0_2[1]._4_4_ = local_334; 3 < a0_2[1]._4_4_; a0_2[1]._4_4_ = a0_2[1]._4_4_ + -4) {
    auVar22 = local_1130[1];
    auVar14 = local_1130[2];
    auVar16 = local_1130[3];
    auVar13 = local_1138[1];
    auVar15 = local_1138[2];
    auVar17 = local_1138[3];
    auVar21 = pmulld(*local_1130,*local_1138);
    local_1068 = auVar21._0_8_;
    uStack_1060 = auVar21._8_8_;
    *(undefined8 *)local_1140 = local_1068;
    *(undefined8 *)(local_1140 + 2) = uStack_1060;
    auVar22 = pmulld(auVar22,auVar13);
    local_1088 = auVar22._0_8_;
    uStack_1080 = auVar22._8_8_;
    *(undefined8 *)(local_1140 + 4) = local_1088;
    *(undefined8 *)(local_1140 + 6) = uStack_1080;
    auVar22 = pmulld(auVar14,auVar15);
    local_10a8 = auVar22._0_8_;
    uStack_10a0 = auVar22._8_8_;
    *(undefined8 *)(local_1140 + 8) = local_10a8;
    *(undefined8 *)(local_1140 + 10) = uStack_10a0;
    auVar22 = pmulld(auVar16,auVar17);
    local_10c8 = auVar22._0_8_;
    uStack_10c0 = auVar22._8_8_;
    *(undefined8 *)(local_1140 + 0xc) = local_10c8;
    *(undefined8 *)(local_1140 + 0xe) = uStack_10c0;
    local_1130 = local_1130 + 4;
    local_1138 = local_1138 + 4;
    local_1140 = local_1140 + 0x10;
  }
  if (1 < a0_2[1]._4_4_) {
    auVar22 = pmulld(*local_1130,*local_1138);
    local_10e8 = auVar22._0_8_;
    uStack_10e0 = auVar22._8_8_;
    *(undefined8 *)local_1140 = local_10e8;
    *(undefined8 *)(local_1140 + 2) = uStack_10e0;
    auVar22 = pmulld(local_1130[1],local_1138[1]);
    local_1108 = auVar22._0_8_;
    uStack_1100 = auVar22._8_8_;
    *(undefined8 *)(local_1140 + 4) = local_1108;
    *(undefined8 *)(local_1140 + 6) = uStack_1100;
    a0_2[1]._4_4_ = a0_2[1]._4_4_ + -2;
    local_1130 = local_1130 + 2;
    local_1138 = local_1138 + 2;
    local_1140 = local_1140 + 8;
  }
  if (a0_2[1]._4_4_ != 0) {
    auVar22 = pmulld(*local_1130,*local_1138);
    local_1128 = auVar22._0_8_;
    uStack_1120 = auVar22._8_8_;
    *(undefined8 *)local_1140 = local_1128;
    *(undefined8 *)(local_1140 + 2) = uStack_1120;
  }
  for (local_20f0 = length - (length & 3); local_20f0 < (int)length; local_20f0 = local_20f0 + 1) {
    pDst[local_20f0] =
         *(int *)(*pSrc1 + (long)local_20f0 * 4) * *(int *)(*pSrc2 + (long)local_20f0 * 4);
  }
  local_20ec = length;
  _i_7 = pDst;
  local_20e0 = pSrc2;
  local_20d8 = pSrc1;
  for (i_11 = 0; i_11 < length; i_11 = i_11 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[i_11],value1 * value2);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x32;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  local_20cc = length;
  local_20c8 = pDst;
  local_20c0 = pSrc2;
  local_20b8 = pSrc1;
  nosimd::arithmetic::div<int>((int *)pSrc1,(int *)pSrc2,pDst,length);
  for (i_13 = 0; i_13 < length; i_13 = i_13 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[i_13],value1 / value2);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x3a;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  uStack_20a8 = CONCAT44(value2,value2);
  uStack_20a0 = CONCAT44(value2,value2);
  local_da0 = pDst;
  local_d90 = pSrc1;
  for (local_da4 = local_334; 3 < local_da4; local_da4 = local_da4 + -4) {
    local_af8 = (int)*(undefined8 *)*local_d90;
    iStack_af4 = (int)((ulong)*(undefined8 *)*local_d90 >> 0x20);
    iStack_af0 = (int)*(undefined8 *)(*local_d90 + 8);
    iStack_aec = (int)((ulong)*(undefined8 *)(*local_d90 + 8) >> 0x20);
    *(ulong *)local_da0 = CONCAT44(iStack_af4 + value2,local_af8 + value2);
    *(ulong *)(local_da0 + 2) = CONCAT44(iStack_aec + value2,iStack_af0 + value2);
    local_b18 = (int)*(undefined8 *)local_d90[1];
    iStack_b14 = (int)((ulong)*(undefined8 *)local_d90[1] >> 0x20);
    iStack_b10 = (int)*(undefined8 *)(local_d90[1] + 8);
    iStack_b0c = (int)((ulong)*(undefined8 *)(local_d90[1] + 8) >> 0x20);
    *(ulong *)(local_da0 + 4) = CONCAT44(iStack_b14 + value2,local_b18 + value2);
    *(ulong *)(local_da0 + 6) = CONCAT44(iStack_b0c + value2,iStack_b10 + value2);
    local_b38 = (int)*(undefined8 *)local_d90[2];
    iStack_b34 = (int)((ulong)*(undefined8 *)local_d90[2] >> 0x20);
    iStack_b30 = (int)*(undefined8 *)(local_d90[2] + 8);
    iStack_b2c = (int)((ulong)*(undefined8 *)(local_d90[2] + 8) >> 0x20);
    *(ulong *)(local_da0 + 8) = CONCAT44(iStack_b34 + value2,local_b38 + value2);
    *(ulong *)(local_da0 + 10) = CONCAT44(iStack_b2c + value2,iStack_b30 + value2);
    local_b58 = (int)*(undefined8 *)local_d90[3];
    iStack_b54 = (int)((ulong)*(undefined8 *)local_d90[3] >> 0x20);
    iStack_b50 = (int)*(undefined8 *)(local_d90[3] + 8);
    iStack_b4c = (int)((ulong)*(undefined8 *)(local_d90[3] + 8) >> 0x20);
    *(ulong *)(local_da0 + 0xc) = CONCAT44(iStack_b54 + value2,local_b58 + value2);
    *(ulong *)(local_da0 + 0xe) = CONCAT44(iStack_b4c + value2,iStack_b50 + value2);
    local_d90 = local_d90 + 4;
    local_da0 = local_da0 + 0x10;
  }
  if (1 < local_da4) {
    local_b78 = (int)*(undefined8 *)*local_d90;
    iStack_b74 = (int)((ulong)*(undefined8 *)*local_d90 >> 0x20);
    iStack_b70 = (int)*(undefined8 *)(*local_d90 + 8);
    iStack_b6c = (int)((ulong)*(undefined8 *)(*local_d90 + 8) >> 0x20);
    *(ulong *)local_da0 = CONCAT44(iStack_b74 + value2,local_b78 + value2);
    *(ulong *)(local_da0 + 2) = CONCAT44(iStack_b6c + value2,iStack_b70 + value2);
    local_b98 = (int)*(undefined8 *)local_d90[1];
    iStack_b94 = (int)((ulong)*(undefined8 *)local_d90[1] >> 0x20);
    iStack_b90 = (int)*(undefined8 *)(local_d90[1] + 8);
    iStack_b8c = (int)((ulong)*(undefined8 *)(local_d90[1] + 8) >> 0x20);
    *(ulong *)(local_da0 + 4) = CONCAT44(iStack_b94 + value2,local_b98 + value2);
    *(ulong *)(local_da0 + 6) = CONCAT44(iStack_b8c + value2,iStack_b90 + value2);
    local_da4 = local_da4 + -2;
    local_d90 = local_d90 + 2;
    local_da0 = local_da0 + 8;
  }
  if (local_da4 != 0) {
    local_bb8 = (int)*(undefined8 *)*local_d90;
    iStack_bb4 = (int)((ulong)*(undefined8 *)*local_d90 >> 0x20);
    iStack_bb0 = (int)*(undefined8 *)(*local_d90 + 8);
    iStack_bac = (int)((ulong)*(undefined8 *)(*local_d90 + 8) >> 0x20);
    *(ulong *)local_da0 = CONCAT44(iStack_bb4 + value2,local_bb8 + value2);
    *(ulong *)(local_da0 + 2) = CONCAT44(iStack_bac + value2,iStack_bb0 + value2);
  }
  for (local_20ac = length - (length & 3); local_20ac < (int)length; local_20ac = local_20ac + 1) {
    pDst[local_20ac] = *(int *)(*pSrc1 + (long)local_20ac * 4) + value2;
  }
  local_208c = length;
  local_2088 = pDst;
  local_207c = value2;
  local_2078 = pSrc1;
  local_1f34 = value2;
  local_1a88 = uStack_20a8;
  uStack_1a80 = uStack_20a0;
  local_1a78 = value2;
  local_1a74 = value2;
  local_1a70 = value2;
  local_1a6c = value2;
  for (i_15 = 0; i_15 < length; i_15 = i_15 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[i_15],value1 + value2);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x43;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  uStack_2068 = CONCAT44(value2,value2);
  uStack_2060 = CONCAT44(value2,value2);
  local_a70 = pDst;
  local_a60 = pSrc1;
  for (local_a74 = local_334; 3 < local_a74; local_a74 = local_a74 + -4) {
    local_758 = (int)*(undefined8 *)*local_a60;
    iStack_754 = (int)((ulong)*(undefined8 *)*local_a60 >> 0x20);
    iStack_750 = (int)*(undefined8 *)(*local_a60 + 8);
    iStack_74c = (int)((ulong)*(undefined8 *)(*local_a60 + 8) >> 0x20);
    *(ulong *)local_a70 = CONCAT44(iStack_754 - value2,local_758 - value2);
    *(ulong *)(local_a70 + 2) = CONCAT44(iStack_74c - value2,iStack_750 - value2);
    local_778 = (int)*(undefined8 *)local_a60[1];
    iStack_774 = (int)((ulong)*(undefined8 *)local_a60[1] >> 0x20);
    iStack_770 = (int)*(undefined8 *)(local_a60[1] + 8);
    iStack_76c = (int)((ulong)*(undefined8 *)(local_a60[1] + 8) >> 0x20);
    *(ulong *)(local_a70 + 4) = CONCAT44(iStack_774 - value2,local_778 - value2);
    *(ulong *)(local_a70 + 6) = CONCAT44(iStack_76c - value2,iStack_770 - value2);
    local_798 = (int)*(undefined8 *)local_a60[2];
    iStack_794 = (int)((ulong)*(undefined8 *)local_a60[2] >> 0x20);
    iStack_790 = (int)*(undefined8 *)(local_a60[2] + 8);
    iStack_78c = (int)((ulong)*(undefined8 *)(local_a60[2] + 8) >> 0x20);
    *(ulong *)(local_a70 + 8) = CONCAT44(iStack_794 - value2,local_798 - value2);
    *(ulong *)(local_a70 + 10) = CONCAT44(iStack_78c - value2,iStack_790 - value2);
    local_7b8 = (int)*(undefined8 *)local_a60[3];
    iStack_7b4 = (int)((ulong)*(undefined8 *)local_a60[3] >> 0x20);
    iStack_7b0 = (int)*(undefined8 *)(local_a60[3] + 8);
    iStack_7ac = (int)((ulong)*(undefined8 *)(local_a60[3] + 8) >> 0x20);
    *(ulong *)(local_a70 + 0xc) = CONCAT44(iStack_7b4 - value2,local_7b8 - value2);
    *(ulong *)(local_a70 + 0xe) = CONCAT44(iStack_7ac - value2,iStack_7b0 - value2);
    local_a60 = local_a60 + 4;
    local_a70 = local_a70 + 0x10;
  }
  if (1 < local_a74) {
    local_7d8 = (int)*(undefined8 *)*local_a60;
    iStack_7d4 = (int)((ulong)*(undefined8 *)*local_a60 >> 0x20);
    iStack_7d0 = (int)*(undefined8 *)(*local_a60 + 8);
    iStack_7cc = (int)((ulong)*(undefined8 *)(*local_a60 + 8) >> 0x20);
    *(ulong *)local_a70 = CONCAT44(iStack_7d4 - value2,local_7d8 - value2);
    *(ulong *)(local_a70 + 2) = CONCAT44(iStack_7cc - value2,iStack_7d0 - value2);
    local_7f8 = (int)*(undefined8 *)local_a60[1];
    iStack_7f4 = (int)((ulong)*(undefined8 *)local_a60[1] >> 0x20);
    iStack_7f0 = (int)*(undefined8 *)(local_a60[1] + 8);
    iStack_7ec = (int)((ulong)*(undefined8 *)(local_a60[1] + 8) >> 0x20);
    *(ulong *)(local_a70 + 4) = CONCAT44(iStack_7f4 - value2,local_7f8 - value2);
    *(ulong *)(local_a70 + 6) = CONCAT44(iStack_7ec - value2,iStack_7f0 - value2);
    local_a74 = local_a74 + -2;
    local_a60 = local_a60 + 2;
    local_a70 = local_a70 + 8;
  }
  if (local_a74 != 0) {
    local_818 = (int)*(undefined8 *)*local_a60;
    iStack_814 = (int)((ulong)*(undefined8 *)*local_a60 >> 0x20);
    iStack_810 = (int)*(undefined8 *)(*local_a60 + 8);
    iStack_80c = (int)((ulong)*(undefined8 *)(*local_a60 + 8) >> 0x20);
    *(ulong *)local_a70 = CONCAT44(iStack_814 - value2,local_818 - value2);
    *(ulong *)(local_a70 + 2) = CONCAT44(iStack_80c - value2,iStack_810 - value2);
  }
  for (local_206c = length - (length & 3); local_206c < (int)length; local_206c = local_206c + 1) {
    pDst[local_206c] = *(int *)(*pSrc1 + (long)local_206c * 4) - value2;
  }
  for (i_17 = 0; local_204c = length, local_2048 = pDst, local_203c = value2, local_2038 = pSrc1,
      local_1f38 = value2, local_1a68 = uStack_2068, uStack_1a60 = uStack_2060, local_1a58 = value2,
      local_1a54 = value2, local_1a50 = value2, local_1a4c = value2, i_17 < length; i_17 = i_17 + 1)
  {
    if (pDst[i_17] != value1 - value2) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x4b;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  uStack_2028 = CONCAT44(value2,value2);
  uStack_2020 = CONCAT44(value2,value2);
  local_740 = pDst;
  local_730 = pSrc1;
  for (local_744 = local_334; 3 < local_744; local_744 = local_744 + -4) {
    local_418 = (int)*(undefined8 *)*local_730;
    iStack_414 = (int)((ulong)*(undefined8 *)*local_730 >> 0x20);
    iStack_410 = (int)*(undefined8 *)(*local_730 + 8);
    iStack_40c = (int)((ulong)*(undefined8 *)(*local_730 + 8) >> 0x20);
    *(ulong *)local_740 = CONCAT44(value2 - iStack_414,value2 - local_418);
    *(ulong *)(local_740 + 2) = CONCAT44(value2 - iStack_40c,value2 - iStack_410);
    local_458 = (int)*(undefined8 *)local_730[1];
    iStack_454 = (int)((ulong)*(undefined8 *)local_730[1] >> 0x20);
    iStack_450 = (int)*(undefined8 *)(local_730[1] + 8);
    iStack_44c = (int)((ulong)*(undefined8 *)(local_730[1] + 8) >> 0x20);
    *(ulong *)(local_740 + 4) = CONCAT44(value2 - iStack_454,value2 - local_458);
    *(ulong *)(local_740 + 6) = CONCAT44(value2 - iStack_44c,value2 - iStack_450);
    local_498 = (int)*(undefined8 *)local_730[2];
    iStack_494 = (int)((ulong)*(undefined8 *)local_730[2] >> 0x20);
    iStack_490 = (int)*(undefined8 *)(local_730[2] + 8);
    iStack_48c = (int)((ulong)*(undefined8 *)(local_730[2] + 8) >> 0x20);
    *(ulong *)(local_740 + 8) = CONCAT44(value2 - iStack_494,value2 - local_498);
    *(ulong *)(local_740 + 10) = CONCAT44(value2 - iStack_48c,value2 - iStack_490);
    local_4d8 = (int)*(undefined8 *)local_730[3];
    iStack_4d4 = (int)((ulong)*(undefined8 *)local_730[3] >> 0x20);
    iStack_4d0 = (int)*(undefined8 *)(local_730[3] + 8);
    iStack_4cc = (int)((ulong)*(undefined8 *)(local_730[3] + 8) >> 0x20);
    *(ulong *)(local_740 + 0xc) = CONCAT44(value2 - iStack_4d4,value2 - local_4d8);
    *(ulong *)(local_740 + 0xe) = CONCAT44(value2 - iStack_4cc,value2 - iStack_4d0);
    local_730 = local_730 + 4;
    local_740 = local_740 + 0x10;
  }
  if (1 < local_744) {
    local_398 = (int)*(undefined8 *)*local_730;
    iStack_394 = (int)((ulong)*(undefined8 *)*local_730 >> 0x20);
    iStack_390 = (int)*(undefined8 *)(*local_730 + 8);
    iStack_38c = (int)((ulong)*(undefined8 *)(*local_730 + 8) >> 0x20);
    *(ulong *)local_740 = CONCAT44(value2 - iStack_394,value2 - local_398);
    *(ulong *)(local_740 + 2) = CONCAT44(value2 - iStack_38c,value2 - iStack_390);
    local_3d8 = (int)*(undefined8 *)local_730[1];
    iStack_3d4 = (int)((ulong)*(undefined8 *)local_730[1] >> 0x20);
    iStack_3d0 = (int)*(undefined8 *)(local_730[1] + 8);
    iStack_3cc = (int)((ulong)*(undefined8 *)(local_730[1] + 8) >> 0x20);
    *(ulong *)(local_740 + 4) = CONCAT44(value2 - iStack_3d4,value2 - local_3d8);
    *(ulong *)(local_740 + 6) = CONCAT44(value2 - iStack_3cc,value2 - iStack_3d0);
    local_744 = local_744 + -2;
    local_730 = local_730 + 2;
    local_740 = local_740 + 8;
  }
  if (local_744 != 0) {
    local_358 = (int)*(undefined8 *)*local_730;
    iStack_354 = (int)((ulong)*(undefined8 *)*local_730 >> 0x20);
    iStack_350 = (int)*(undefined8 *)(*local_730 + 8);
    iStack_34c = (int)((ulong)*(undefined8 *)(*local_730 + 8) >> 0x20);
    *(ulong *)local_740 = CONCAT44(value2 - iStack_354,value2 - local_358);
    *(ulong *)(local_740 + 2) = CONCAT44(value2 - iStack_34c,value2 - iStack_350);
  }
  for (local_202c = length - (length & 3); local_202c < (int)length; local_202c = local_202c + 1) {
    pDst[local_202c] = value2 - *(int *)(*pSrc1 + (long)local_202c * 4);
  }
  local_200c = length;
  local_2008 = pDst;
  local_1ffc = value2;
  local_1ff8 = pSrc1;
  local_1f3c = value2;
  local_1a48 = uStack_2028;
  uStack_1a40 = uStack_2020;
  local_1a38 = value2;
  local_1a34 = value2;
  local_1a30 = value2;
  local_1a2c = value2;
  for (i_18 = 0; i_18 < length; i_18 = i_18 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[i_18],value2 - value1);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x53;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  uStack_1fe8 = CONCAT44(value2,value2);
  uStack_1fe0 = CONCAT44(value2,value2);
  local_330 = pDst;
  local_320 = pSrc1;
  for (; 3 < local_334; local_334 = local_334 + -4) {
    auVar22._8_8_ = uStack_1fe0;
    auVar22._0_8_ = uStack_1fe8;
    auVar22 = pmulld(*local_320,auVar22);
    local_258 = auVar22._0_8_;
    uStack_250 = auVar22._8_8_;
    *(undefined8 *)local_330 = local_258;
    *(undefined8 *)(local_330 + 2) = uStack_250;
    auVar13._8_8_ = uStack_1fe0;
    auVar13._0_8_ = uStack_1fe8;
    auVar22 = pmulld(local_320[1],auVar13);
    local_278 = auVar22._0_8_;
    uStack_270 = auVar22._8_8_;
    *(undefined8 *)(local_330 + 4) = local_278;
    *(undefined8 *)(local_330 + 6) = uStack_270;
    auVar14._8_8_ = uStack_1fe0;
    auVar14._0_8_ = uStack_1fe8;
    auVar22 = pmulld(local_320[2],auVar14);
    local_298 = auVar22._0_8_;
    uStack_290 = auVar22._8_8_;
    *(undefined8 *)(local_330 + 8) = local_298;
    *(undefined8 *)(local_330 + 10) = uStack_290;
    auVar15._8_8_ = uStack_1fe0;
    auVar15._0_8_ = uStack_1fe8;
    auVar22 = pmulld(local_320[3],auVar15);
    local_2b8 = auVar22._0_8_;
    uStack_2b0 = auVar22._8_8_;
    *(undefined8 *)(local_330 + 0xc) = local_2b8;
    *(undefined8 *)(local_330 + 0xe) = uStack_2b0;
    local_320 = local_320 + 4;
    local_330 = local_330 + 0x10;
  }
  if (1 < local_334) {
    auVar16._8_8_ = uStack_1fe0;
    auVar16._0_8_ = uStack_1fe8;
    auVar22 = pmulld(*local_320,auVar16);
    local_2d8 = auVar22._0_8_;
    uStack_2d0 = auVar22._8_8_;
    *(undefined8 *)local_330 = local_2d8;
    *(undefined8 *)(local_330 + 2) = uStack_2d0;
    auVar17._8_8_ = uStack_1fe0;
    auVar17._0_8_ = uStack_1fe8;
    auVar22 = pmulld(local_320[1],auVar17);
    local_2f8 = auVar22._0_8_;
    uStack_2f0 = auVar22._8_8_;
    *(undefined8 *)(local_330 + 4) = local_2f8;
    *(undefined8 *)(local_330 + 6) = uStack_2f0;
    local_334 = local_334 + -2;
    local_320 = local_320 + 2;
    local_330 = local_330 + 8;
  }
  if (local_334 != 0) {
    auVar21._8_8_ = uStack_1fe0;
    auVar21._0_8_ = uStack_1fe8;
    auVar22 = pmulld(*local_320,auVar21);
    local_318 = auVar22._0_8_;
    uStack_310 = auVar22._8_8_;
    *(undefined8 *)local_330 = local_318;
    *(undefined8 *)(local_330 + 2) = uStack_310;
  }
  for (local_1fec = length - (length & 3); local_1fec < (int)length; local_1fec = local_1fec + 1) {
    pDst[local_1fec] = *(int *)(*pSrc1 + (long)local_1fec * 4) * value2;
  }
  for (i_19 = 0; local_1fcc = length, local_1fc8 = pDst, local_1fbc = value2, local_1fb8 = pSrc1,
      local_1f40 = value2, local_1a28 = uStack_1fe8, uStack_1a20 = uStack_1fe0, local_1a18 = value2,
      local_1a14 = value2, local_1a10 = value2, local_1a0c = value2, i_19 < length; i_19 = i_19 + 1)
  {
    if (pDst[i_19] != value1 * value2) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x5b;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  local_1fac = length;
  local_1fa8 = pDst;
  local_1f9c = value2;
  local_1f98 = pSrc1;
  nosimd::arithmetic::divC<int>((int *)pSrc1,value2,pDst,length);
  for (local_2224 = 0; local_2224 < length; local_2224 = local_2224 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[local_2224],value1 / value2);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 99;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  local_1f8c = length;
  local_1f88 = pDst;
  local_1f7c = value2;
  local_1f78 = pSrc1;
  nosimd::arithmetic::divCRev<int>((int *)pSrc1,value2,pDst,length);
  for (local_2228 = 0; local_2228 < length; local_2228 = local_2228 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<int>(pDst[local_2228],value2 / value1);
    if (!bVar18) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
      *(undefined4 *)(puVar20 + 1) = 0x6b;
      *(uint *)((long)puVar20 + 0xc) = length;
      __cxa_throw(puVar20,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) && (pDst[length] != 0x7f)) {
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar20 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
    *(undefined4 *)(puVar20 + 1) = 0x70;
    *(uint *)((long)puVar20 + 0xc) = length;
    __cxa_throw(puVar20,&Exception::typeinfo,0);
  }
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&v1);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)local_21c0);
  std::shared_ptr<int>::~shared_ptr
            ((shared_ptr<int> *)&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}